

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O2

int Mvc_CubeCompareSizeAndInt(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pC1->nOnes < pC2->nOnes) {
    return 1;
  }
  iVar2 = -1;
  if (pC2->nOnes < pC1->nOnes) {
    return iVar2;
  }
  uVar3 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar3 != 0) {
    if (uVar3 != 1) {
      while( true ) {
        if ((int)uVar3 < 0) {
          return 0;
        }
        uVar4 = (ulong)uVar3;
        uVar5 = (ulong)uVar3;
        if (pC1->pData[uVar4] < pC2->pData[uVar5]) break;
        uVar3 = uVar3 - 1;
        if (pC2->pData[uVar5] < pC1->pData[uVar4]) {
          return 1;
        }
      }
      return iVar2;
    }
    uVar3 = *(uint *)&pC2->field_0x14;
    uVar1 = *(uint *)&pC1->field_0x14;
    if (uVar1 < uVar3) {
      return iVar2;
    }
    if (uVar1 >= uVar3 && uVar1 != uVar3) {
      return 1;
    }
  }
  if (pC1->pData[0] < pC2->pData[0]) {
    return -1;
  }
  return (int)(pC2->pData[0] < pC1->pData[0]);
}

Assistant:

int Mvc_CubeCompareSizeAndInt( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    // compare the cubes by size
    if ( Mvc_CubeReadSize( pC1 ) < Mvc_CubeReadSize( pC2 ) )
        return 1;
    if ( Mvc_CubeReadSize( pC1 ) > Mvc_CubeReadSize( pC2 ) )
        return -1;
    // the cubes have the same size

    // compare the cubes as integers
    if ( Mvc_Cube1Words( pC1 ) )
    {
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else if ( Mvc_Cube2Words( pC1 ) )
    {
        if ( pC1->pData[1] < pC2->pData[1] )
            return -1;
        if ( pC1->pData[1] > pC2->pData[1] )
            return 1;
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast( pC1 );
        for(; i >= 0; i--)
        {
            if ( pC1->pData[i] < pC2->pData[i] )
                return -1;
            if ( pC1->pData[i] > pC2->pData[i] )
                return 1;
        }
        return 0;
    }
}